

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  stbtt_uint8 sVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  ImWchar IVar5;
  ImFont *pIVar6;
  ImFont **ppIVar7;
  stbtt_uint8 *data;
  undefined8 *puVar8;
  ImFontConfig *pIVar9;
  stbrp_node *psVar10;
  stbtt__buf fontdict;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined8 ptr;
  undefined4 fontstart;
  size_t sVar14;
  bool bVar15;
  ushort uVar16;
  short sVar17;
  stbtt_uint32 sVar18;
  uint uVar26;
  int iVar27;
  int iVar28;
  stbtt__active_edge *z;
  stbtt_uint32 sVar19;
  stbtt_uint32 sVar20;
  stbtt_uint32 sVar21;
  stbtt_uint32 sVar22;
  stbtt_uint32 sVar23;
  stbtt_uint32 sVar24;
  stbtt_uint32 sVar25;
  ulong uVar29;
  int *piVar30;
  void *pvVar31;
  void *pvVar32;
  stbrp_context *ptr_00;
  uchar *puVar33;
  long lVar34;
  stbtt__point *points;
  stbtt__edge *p_00;
  stbtt__buf *scanline;
  stbtt__buf *psVar35;
  undefined1 auVar36 [8];
  undefined8 *puVar37;
  short sVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  ImWchar *pIVar42;
  uint *puVar43;
  ulong uVar44;
  stbtt__active_edge *psVar45;
  stbtt__active_edge *psVar46;
  char *__function;
  ImWchar IVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  size_t sVar51;
  byte *pbVar52;
  uint codepoint;
  uint uVar53;
  uint uVar54;
  uchar uVar55;
  ulong uVar56;
  size_t size;
  byte *pbVar57;
  ulong uVar58;
  int iVar59;
  ulong uVar60;
  int iVar61;
  long lVar62;
  uint *puVar63;
  stbtt__edge *psVar64;
  byte bVar65;
  void *p;
  stbtt_fontinfo *psVar66;
  stbtt__active_edge *psVar67;
  long lVar68;
  bool bVar69;
  float fVar70;
  float fVar71;
  undefined4 uVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float in_XMM3_Da;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  stbtt__buf sVar81;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 uVar82;
  ImFontConfig *pIVar83;
  void *local_490;
  undefined4 uVar84;
  undefined8 in_stack_fffffffffffffb90;
  float local_468;
  int local_450;
  stbtt_uint32 local_44c;
  void *local_448;
  undefined1 local_440 [8];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  ulong local_410;
  ulong local_408;
  int local_3fc;
  void *local_3f8;
  stbtt__active_edge *local_3f0;
  undefined8 local_3e8;
  void *pvStack_3e0;
  stbrp_node *local_3d0;
  ulong local_3c8;
  undefined8 local_3c0;
  float local_3b4;
  float local_3b0;
  uint local_3ac;
  undefined1 local_3a8 [16];
  stbtt_fontinfo *local_390;
  undefined8 *local_388;
  float local_380;
  float local_37c;
  int local_378;
  float local_374;
  long local_370;
  long local_368;
  ulong local_360;
  uchar *local_358;
  stbtt__point *local_350;
  uchar *local_348;
  ulong local_340;
  ulong local_338;
  float *local_330;
  size_t local_328;
  float local_320;
  float local_31c;
  uint local_318;
  uint local_314;
  int local_310;
  int local_30c;
  float local_308;
  int local_304;
  int local_300;
  int local_2fc;
  undefined1 local_2f8 [16];
  stbrp_context *local_2e8;
  float *local_2e0;
  float local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  size_t local_2c0;
  ImFontConfig *local_2b8;
  long local_2b0;
  short *local_2a8;
  long local_2a0;
  ulong local_298;
  ulong local_290;
  long local_288;
  size_t local_280;
  size_t local_278;
  int local_270;
  int local_26c;
  undefined1 local_268 [16];
  stbtt__buf local_258 [33];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_3a8._8_8_ = local_3a8._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                  ,0x918,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  local_490 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar4 = (atlas->ConfigData).Size;
  lVar40 = (long)(int)uVar4;
  if (0 < lVar40) {
    uVar29 = 8;
    if (8 < (int)uVar4) {
      uVar29 = (ulong)uVar4;
    }
    local_490 = ImGui::MemAlloc(uVar29 * 0x110);
  }
  uVar26 = (atlas->Fonts).Size;
  lVar68 = (long)(int)uVar26;
  if (lVar68 < 1) {
    local_3f8 = (void *)0x0;
  }
  else {
    uVar29 = 8;
    if (8 < (int)uVar26) {
      uVar29 = (ulong)uVar26;
    }
    local_3f8 = ImGui::MemAlloc(uVar29 << 5);
  }
  local_2c0 = lVar40 * 0x110;
  memset(local_490,0,local_2c0);
  local_328 = lVar68 << 5;
  memset(local_3f8,0,local_328);
  uVar26 = (atlas->ConfigData).Size;
  uVar29 = (ulong)uVar26;
  uVar82 = CONCAT13((int)uVar26 < 1,(int3)in_stack_fffffffffffffb64);
  local_3a8._0_8_ = lVar68;
  if (0 < (int)uVar26) {
    uVar41 = 0;
    if (0 < (int)uVar4) {
      uVar41 = (ulong)uVar4;
    }
    local_2f8._0_8_ = uVar41;
    lVar62 = 0;
    do {
      if (lVar62 == local_2f8._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_0022353f;
      }
      if ((int)uVar29 <= lVar62) goto LAB_002235a6;
      pIVar83 = (atlas->ConfigData).Data;
      pIVar6 = pIVar83[lVar62].DstFont;
      if ((pIVar6 == (ImFont *)0x0) ||
         (pIVar6->ContainerAtlas != atlas && pIVar6->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                      ,0x930,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)local_490 + lVar62 * 0x110 + 0xe0) = 0xffffffff;
      uVar29 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar29 < 1) {
LAB_002235f6:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                      ,0x939,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar83 = pIVar83 + lVar62;
      ppIVar7 = (atlas->Fonts).Data;
      uVar56 = 0xffffffff;
      uVar41 = 0;
      do {
        if (pIVar6 == ppIVar7[uVar41]) {
          *(int *)((long)local_490 + lVar62 * 0x110 + 0xe0) = (int)uVar41;
          uVar56 = uVar41 & 0xffffffff;
        }
        uVar41 = uVar41 + 1;
      } while ((uVar41 < uVar29) && ((int)uVar56 == -1));
      if ((int)uVar56 == -1) goto LAB_002235f6;
      uVar72 = (undefined4)lVar62;
      uVar84 = (undefined4)((ulong)lVar62 >> 0x20);
      data = (stbtt_uint8 *)pIVar83->FontData;
      iVar27 = pIVar83->FontNo;
      sVar1 = *data;
      if (((((sVar1 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar1 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_00220599:
        sVar25 = -(uint)(iVar27 != 0);
      }
      else {
        if (sVar1 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_00220571;
          goto LAB_00220599;
        }
        if ((((sVar1 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_00220599;
LAB_00220571:
        sVar25 = 0xffffffff;
        if (sVar1 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar26 = *(uint *)(data + 4);
              uVar26 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                       uVar26 << 0x18;
              if (((uVar26 == 0x20000) || (uVar26 == 0x10000)) &&
                 (uVar26 = *(uint *)(data + 8),
                 iVar27 < (int)(uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                               uVar26 << 0x18))) {
                uVar26 = *(uint *)(data + (long)iVar27 * 4 + 0xc);
                sVar25 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                         uVar26 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_00220599;
        }
      }
      if ((int)sVar25 < 0) {
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                      ,0x93e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(stbtt_uint8 **)((long)local_490 + lVar62 * 0x110 + 8) = data;
      *(stbtt_uint32 *)((long)local_490 + lVar62 * 0x110 + 0x10) = sVar25;
      *(undefined8 *)((long)local_490 + lVar62 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)local_490 + lVar62 * 0x110 + 0x48) = 0;
      sVar18 = stbtt__find_table(data,sVar25,"cmap");
      sVar19 = stbtt__find_table(data,sVar25,"loca");
      *(stbtt_uint32 *)((long)local_490 + lVar62 * 0x110 + 0x18) = sVar19;
      sVar20 = stbtt__find_table(data,sVar25,"head");
      *(stbtt_uint32 *)((long)local_490 + lVar62 * 0x110 + 0x1c) = sVar20;
      sVar21 = stbtt__find_table(data,sVar25,"glyf");
      *(stbtt_uint32 *)((long)local_490 + lVar62 * 0x110 + 0x20) = sVar21;
      sVar22 = stbtt__find_table(data,sVar25,"hhea");
      *(stbtt_uint32 *)((long)local_490 + lVar62 * 0x110 + 0x24) = sVar22;
      sVar23 = stbtt__find_table(data,sVar25,"hmtx");
      *(stbtt_uint32 *)((long)local_490 + lVar62 * 0x110 + 0x28) = sVar23;
      sVar24 = stbtt__find_table(data,sVar25,"kern");
      *(stbtt_uint32 *)((long)local_490 + lVar62 * 0x110 + 0x2c) = sVar24;
      local_428._0_4_ = sVar25;
      sVar25 = stbtt__find_table(data,sVar25,"GPOS");
      *(stbtt_uint32 *)((long)local_490 + lVar62 * 0x110 + 0x30) = sVar25;
      if ((((sVar18 == 0) || (sVar20 == 0)) || (sVar22 == 0)) || (sVar23 == 0)) goto LAB_00223418;
      fontstart = local_428._0_4_;
      if (sVar21 == 0) {
        local_3e8 = CONCAT44(local_3e8._4_4_,2);
        local_440 = (undefined1  [8])((ulong)local_440 & 0xffffffff00000000);
        local_3c0._0_4_ = 0;
        local_44c = 0;
        sVar25 = stbtt__find_table(data,local_428._0_4_,"CFF ");
        if (sVar25 == 0) goto LAB_00223418;
        *(undefined8 *)((long)local_490 + lVar62 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)local_490 + lVar62 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)local_490 + lVar62 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)local_490 + lVar62 * 0x110 + 0x88) = 0;
        *(stbtt_uint8 **)((long)local_490 + lVar62 * 0x110 + 0x40) = data + sVar25;
        *(undefined8 *)((long)local_490 + lVar62 * 0x110 + 0x48) = 0x2000000000000000;
        local_258[0].data = *(uchar **)((long)local_490 + lVar62 * 0x110 + 0x40);
        local_258[0]._8_8_ = *(undefined8 *)((long)local_490 + lVar62 * 0x110 + 0x48);
        if ((long)local_258[0].cursor < -2) {
LAB_00223668:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                        ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        lVar68 = (long)local_258[0].cursor + 2;
        iVar27 = (int)lVar68;
        if (local_258[0].size < iVar27) goto LAB_00223668;
        uVar26 = 0;
        if (iVar27 < local_258[0].size) {
          iVar27 = local_258[0].cursor + 3;
          uVar26 = (uint)local_258[0].data[lVar68];
        }
        local_258[0].cursor = iVar27;
        if (local_258[0].size < (int)uVar26) goto LAB_00223668;
        local_258[0].cursor = uVar26;
        stbtt__cff_get_index(local_258);
        sVar81 = stbtt__cff_get_index(local_258);
        local_438 = (undefined1  [16])stbtt__cff_index_get(sVar81,0);
        stbtt__cff_get_index(local_258);
        sVar81 = stbtt__cff_get_index(local_258);
        *(stbtt__buf *)((long)local_490 + lVar62 * 0x110 + 0x60) = sVar81;
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x11,1,(stbtt_uint32 *)local_440);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x106,1,(stbtt_uint32 *)&local_3e8);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x124,1,(stbtt_uint32 *)&local_3c0);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x125,1,&local_44c);
        sVar81.data._4_4_ = uVar82;
        sVar81.data._0_4_ = sVar19;
        sVar81.cursor = (int)pIVar83;
        sVar81.size = (int)((ulong)pIVar83 >> 0x20);
        fontdict.data._4_4_ = uVar84;
        fontdict.data._0_4_ = uVar72;
        fontdict.cursor = (int)in_stack_fffffffffffffb90;
        fontdict.size = (int)((ulong)in_stack_fffffffffffffb90 >> 0x20);
        sVar81 = stbtt__get_subrs(sVar81,fontdict);
        sVar25 = local_44c;
        *(stbtt__buf *)((long)local_490 + lVar62 * 0x110 + 0x70) = sVar81;
        if (((stbtt_uint32)local_3e8 != 2) || (uVar13 = local_440._0_4_, local_440._0_4_ == 0))
        goto LAB_00223418;
        if ((stbtt_uint32)local_3c0 != 0) {
          uVar29 = (ulong)local_44c;
          if (uVar29 == 0) goto LAB_00223418;
          if (((int)(stbtt_uint32)local_3c0 < 0) ||
             (local_258[0].size < (int)(stbtt_uint32)local_3c0)) goto LAB_00223668;
          local_258[0].cursor = (stbtt_uint32)local_3c0;
          sVar81 = stbtt__cff_get_index(local_258);
          *(stbtt__buf *)((long)local_490 + lVar62 * 0x110 + 0x80) = sVar81;
          puVar33 = local_258[0].data + uVar29;
          lVar68 = (ulong)(local_258[0].size - sVar25) << 0x20;
          if ((int)(local_258[0].size - sVar25 | sVar25) < 0 || local_258[0].size < (int)sVar25) {
            puVar33 = (uchar *)0x0;
            lVar68 = 0;
          }
          *(uchar **)((long)local_490 + lVar62 * 0x110 + 0x90) = puVar33;
          *(long *)((long)local_490 + lVar62 * 0x110 + 0x98) = lVar68;
        }
        if (((int)uVar13 < 0) || (local_258[0].size < (int)uVar13)) goto LAB_00223668;
        local_258[0].cursor = uVar13;
        sVar81 = stbtt__cff_get_index(local_258);
        *(stbtt__buf *)((long)local_490 + lVar62 * 0x110 + 0x50) = sVar81;
        lVar68 = local_3a8._0_8_;
      }
      else {
        lVar68 = local_3a8._0_8_;
        if (sVar19 == 0) goto LAB_00223418;
      }
      sVar25 = stbtt__find_table(data,fontstart,"maxp");
      if (sVar25 == 0) {
        uVar26 = 0xffff;
      }
      else {
        uVar26 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar25 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar25 + 4) >> 8);
      }
      *(uint *)((long)local_490 + lVar62 * 0x110 + 0x14) = uVar26;
      uVar16 = *(ushort *)(data + (ulong)sVar18 + 2) << 8 |
               *(ushort *)(data + (ulong)sVar18 + 2) >> 8;
      *(undefined4 *)((long)local_490 + lVar62 * 0x110 + 0x34) = 0;
      if (uVar16 != 0) {
        uVar26 = sVar18 + 4;
        uVar29 = (ulong)uVar16;
        do {
          uVar16 = *(ushort *)(data + uVar26) << 8 | *(ushort *)(data + uVar26) >> 8;
          if ((uVar16 == 0) ||
             ((uVar16 == 3 &&
              ((uVar16 = *(ushort *)(data + (ulong)uVar26 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar26 + 2) >> 8, uVar16 == 10 || (uVar16 == 1)))
              ))) {
            uVar53 = *(uint *)(data + (ulong)uVar26 + 4);
            *(uint *)((long)local_490 + lVar62 * 0x110 + 0x34) =
                 (uVar53 >> 0x18 | (uVar53 & 0xff0000) >> 8 | (uVar53 & 0xff00) << 8 |
                 uVar53 << 0x18) + sVar18;
          }
          uVar26 = uVar26 + 8;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
      }
      if (*(int *)((long)local_490 + lVar62 * 0x110 + 0x34) == 0) goto LAB_00223418;
      *(uint *)((long)local_490 + lVar62 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)local_490 + lVar62 * 0x110 + 0x1c) + 0x32)
                          << 8 | *(ushort *)
                                  (data + (long)*(int *)((long)local_490 + lVar62 * 0x110 + 0x1c) +
                                          0x32) >> 8);
      iVar27 = *(int *)((long)local_490 + lVar62 * 0x110 + 0xe0);
      if (((long)iVar27 < 0) || ((int)lVar68 <= iVar27)) goto LAB_002235bd;
      pIVar42 = pIVar83->GlyphRanges;
      if (pIVar42 == (ImWchar *)0x0) {
        pIVar42 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)local_490 + lVar62 * 0x110 + 0xd8) = pIVar42;
      IVar47 = *pIVar42;
      while (IVar47 != 0) {
        IVar47 = pIVar42[1];
        if (IVar47 == 0) break;
        IVar5 = *(ImWchar *)((long)local_490 + lVar62 * 0x110 + 0xe4);
        if ((int)IVar47 < (int)IVar5) {
          IVar47 = IVar5;
        }
        *(ImWchar *)((long)local_490 + lVar62 * 0x110 + 0xe4) = IVar47;
        IVar47 = pIVar42[2];
        pIVar42 = pIVar42 + 2;
      }
      piVar30 = (int *)((long)iVar27 * 0x20 + (long)local_3f8);
      *piVar30 = *piVar30 + 1;
      iVar27 = *(int *)((long)local_490 + lVar62 * 0x110 + 0xe4);
      if (iVar27 < piVar30[1]) {
        iVar27 = piVar30[1];
      }
      piVar30[1] = iVar27;
      lVar62 = CONCAT44(uVar84,uVar72) + 1;
      uVar29 = (ulong)(atlas->ConfigData).Size;
      uVar82 = CONCAT13((long)uVar29 <= lVar62,(int3)uVar82);
    } while (lVar62 < (long)uVar29);
  }
  uVar26 = 0;
  if (0 < (int)uVar4) {
    lVar62 = 0;
    uVar26 = 0;
    do {
      iVar27 = *(int *)((long)local_490 + lVar62 * 0x110 + 0xe0);
      lVar50 = (long)iVar27;
      if ((lVar50 < 0) || ((int)lVar68 <= iVar27)) goto LAB_002235bd;
      local_428._0_8_ = lVar62;
      psVar66 = (stbtt_fontinfo *)(lVar62 * 0x110 + (long)local_490);
      ImBitVector::Create((ImBitVector *)&psVar66[1].charstrings,
                          *(int *)((long)&psVar66[1].cff.data + 4) + 1);
      pvVar32 = local_3f8;
      this = (ImBitVector *)((long)local_3f8 + lVar50 * 0x20 + 0x10);
      if (*(int *)((long)local_3f8 + lVar50 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)((long)local_3f8 + lVar50 * 0x20 + 4) + 1);
      }
      puVar63 = *(uint **)&psVar66[1].indexToLocFormat;
      uVar53 = *puVar63;
      for (; (uVar53 != 0 && (puVar63[1] != 0)); puVar63 = puVar63 + 2) {
        for (; uVar53 <= puVar63[1]; uVar53 = uVar53 + 1) {
          bVar15 = ImBitVector::TestBit(this,uVar53);
          if ((!bVar15) && (iVar27 = stbtt_FindGlyphIndex(psVar66,uVar53), iVar27 != 0)) {
            piVar30 = &psVar66[1].cff.cursor;
            *piVar30 = *piVar30 + 1;
            piVar30 = (int *)((long)pvVar32 + lVar50 * 0x20 + 8);
            *piVar30 = *piVar30 + 1;
            ImBitVector::SetBit((ImBitVector *)&psVar66[1].charstrings,uVar53);
            ImBitVector::SetBit(this,uVar53);
            uVar26 = uVar26 + 1;
          }
        }
        uVar53 = puVar63[2];
      }
      lVar62 = local_428._0_8_ + 1;
      lVar68 = local_3a8._0_8_;
    } while (lVar62 != lVar40);
  }
  if (0 < (int)uVar4) {
    lVar68 = 0;
    do {
      uVar72 = (undefined4)lVar68;
      uVar84 = (undefined4)((ulong)lVar68 >> 0x20);
      lVar68 = lVar68 * 0x110;
      iVar27 = *(int *)((long)local_490 + lVar68 + 0xe8);
      if (*(int *)((long)local_490 + lVar68 + 0x104) < iVar27) {
        pvVar31 = ImGui::MemAlloc((long)iVar27 << 2);
        pvVar32 = *(void **)((long)local_490 + lVar68 + 0x108);
        if (pvVar32 != (void *)0x0) {
          memcpy(pvVar31,pvVar32,(long)*(int *)((long)local_490 + lVar68 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)local_490 + lVar68 + 0x108));
        }
        *(void **)((long)local_490 + lVar68 + 0x108) = pvVar31;
        *(int *)((long)local_490 + lVar68 + 0x104) = iVar27;
      }
      lVar62 = (long)*(int *)((long)local_490 + lVar68 + 0xf0);
      if (0 < lVar62) {
        puVar43 = *(uint **)((long)local_490 + lVar68 + 0xf8);
        puVar63 = puVar43 + lVar62;
        iVar27 = 0;
        do {
          local_428._0_8_ = puVar43;
          uVar53 = *puVar43;
          if (uVar53 != 0) {
            uVar54 = 0;
            do {
              if ((uVar53 >> (uVar54 & 0x1f) & 1) != 0) {
                iVar61 = *(int *)((long)local_490 + lVar68 + 0x100);
                iVar28 = *(int *)((long)local_490 + lVar68 + 0x104);
                if (iVar61 == iVar28) {
                  if (iVar28 == 0) {
                    iVar39 = 8;
                  }
                  else {
                    iVar39 = iVar28 / 2 + iVar28;
                  }
                  iVar61 = iVar61 + 1;
                  if (iVar61 < iVar39) {
                    iVar61 = iVar39;
                  }
                  if (iVar28 < iVar61) {
                    pvVar31 = ImGui::MemAlloc((long)iVar61 << 2);
                    pvVar32 = *(void **)((long)local_490 + lVar68 + 0x108);
                    if (pvVar32 != (void *)0x0) {
                      memcpy(pvVar31,pvVar32,(long)*(int *)((long)local_490 + lVar68 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)local_490 + lVar68 + 0x108));
                    }
                    *(void **)((long)local_490 + lVar68 + 0x108) = pvVar31;
                    *(int *)((long)local_490 + lVar68 + 0x104) = iVar61;
                  }
                }
                *(uint *)(*(long *)((long)local_490 + lVar68 + 0x108) +
                         (long)*(int *)((long)local_490 + lVar68 + 0x100) * 4) = iVar27 + uVar54;
                piVar30 = (int *)((long)local_490 + lVar68 + 0x100);
                *piVar30 = *piVar30 + 1;
              }
              uVar54 = uVar54 + 1;
            } while (uVar54 != 0x20);
          }
          puVar43 = (uint *)(local_428._0_8_ + 4);
          iVar27 = iVar27 + 0x20;
        } while (puVar43 < puVar63);
      }
      pvVar32 = *(void **)((long)local_490 + lVar68 + 0xf8);
      if (pvVar32 != (void *)0x0) {
        *(undefined8 *)((long)local_490 + lVar68 + 0xf0) = 0;
        ImGui::MemFree(pvVar32);
        *(undefined8 *)((long)local_490 + lVar68 + 0xf8) = 0;
      }
      if (*(int *)((long)local_490 + lVar68 + 0x100) != *(int *)((long)local_490 + lVar68 + 0xe8)) {
        __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                      ,0x96d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      lVar68 = CONCAT44(uVar84,uVar72) + 1;
    } while (lVar68 != lVar40);
  }
  sVar14 = local_328;
  pvVar32 = local_3f8;
  if (0 < (int)local_3a8._0_4_) {
    sVar51 = 0;
    do {
      pvVar31 = *(void **)((long)pvVar32 + sVar51 + 0x18);
      if (pvVar31 != (void *)0x0) {
        *(undefined8 *)((long)pvVar32 + sVar51 + 0x10) = 0;
        ImGui::MemFree(pvVar31);
        *(undefined8 *)((long)pvVar32 + sVar51 + 0x18) = 0;
      }
      sVar51 = sVar51 + 0x20;
    } while (sVar14 != sVar51);
  }
  if (local_3f8 != (void *)0x0) {
    ImGui::MemFree(local_3f8);
    local_3f8 = (void *)0x0;
  }
  local_438 = ZEXT816(0);
  local_3e8 = 0;
  pvStack_3e0 = (void *)0x0;
  if (0 < (int)uVar26) {
    uVar53 = 8;
    if (7 < (int)uVar26) {
      uVar53 = uVar26;
    }
    if (0 < (int)uVar53) {
      pvVar32 = ImGui::MemAlloc((long)(int)uVar53 << 4);
      if ((void *)local_438._8_8_ != (void *)0x0) {
        memcpy(pvVar32,(void *)local_438._8_8_,(long)(int)local_438._0_4_ << 4);
        ImGui::MemFree((void *)local_438._8_8_);
      }
      auVar12._4_8_ = pvVar32;
      auVar12._0_4_ = uVar53;
      auVar12._12_4_ = 0;
      local_438 = auVar12 << 0x20;
    }
  }
  local_438._0_4_ = uVar26;
  if (local_3e8._4_4_ < (int)uVar26) {
    if (local_3e8._4_4_ == 0) {
      uVar53 = 8;
    }
    else {
      uVar53 = local_3e8._4_4_ / 2 + local_3e8._4_4_;
    }
    if ((int)uVar53 <= (int)uVar26) {
      uVar53 = uVar26;
    }
    if (local_3e8._4_4_ < (int)uVar53) {
      pvVar32 = ImGui::MemAlloc((long)(int)uVar53 * 0x1c);
      if (pvStack_3e0 != (void *)0x0) {
        memcpy(pvVar32,pvStack_3e0,(long)(int)(stbtt_uint32)local_3e8 * 0x1c);
        ImGui::MemFree(pvStack_3e0);
      }
      local_3e8 = (ulong)uVar53 << 0x20;
      pvStack_3e0 = pvVar32;
    }
  }
  local_3e8 = CONCAT44(local_3e8._4_4_,uVar26);
  iVar27 = 0;
  memset((void *)local_438._8_8_,0,(long)(int)local_438._0_4_ << 4);
  memset(pvStack_3e0,0,(long)(int)(stbtt_uint32)local_3e8 * 0x1c);
  fVar70 = 0.0;
  if (0 < (int)uVar4) {
    lVar68 = 0;
    uVar26 = 0;
    uVar53 = 0;
    do {
      iVar61 = *(int *)((long)local_490 + lVar68 * 0x110 + 0xe8);
      if (iVar61 != 0) {
        if (((int)uVar26 < 0) || ((int)local_438._0_4_ <= (int)uVar26)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_0022353f;
        }
        psVar66 = (stbtt_fontinfo *)(lVar68 * 0x110 + (long)local_490);
        *(ulong *)&psVar66[1].hmtx = (ulong)uVar26 * 0x10 + local_438._8_8_;
        if (((int)uVar53 < 0) || ((int)(stbtt_uint32)local_3e8 <= (int)uVar53)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_0022353f;
        }
        pvVar32 = (void *)((ulong)uVar53 * 0x1c + (long)pvStack_3e0);
        *(void **)&psVar66[1].gpos = pvVar32;
        if ((atlas->ConfigData).Size <= lVar68) goto LAB_002235a6;
        pIVar83 = (atlas->ConfigData).Data;
        fVar70 = pIVar83[lVar68].SizePixels;
        *(float *)&psVar66[1].userdata = fVar70;
        *(undefined4 *)((long)&psVar66[1].userdata + 4) = 0;
        psVar66[1].data = *(uchar **)&psVar66[1].gsubrs.cursor;
        psVar66[1].fontstart = *(int *)&psVar66[1].gsubrs.data;
        *(void **)&psVar66[1].loca = pvVar32;
        *(char *)&psVar66[1].glyf = (char)pIVar83[lVar68].OversampleH;
        *(char *)((long)&psVar66[1].glyf + 1) = (char)pIVar83[lVar68].OversampleV;
        if (fVar70 <= 0.0) {
          fVar70 = -fVar70;
          uVar54 = (uint)(ushort)(*(ushort *)(psVar66->data + (long)psVar66->head + 0x12) << 8 |
                                 *(ushort *)(psVar66->data + (long)psVar66->head + 0x12) >> 8);
        }
        else {
          puVar33 = psVar66->data;
          lVar62 = (long)psVar66->hhea;
          uVar54 = ((int)(short)((ushort)puVar33[lVar62 + 4] << 8) | (uint)puVar33[lVar62 + 5]) -
                   ((int)(short)((ushort)puVar33[lVar62 + 6] << 8) | (uint)puVar33[lVar62 + 7]);
        }
        fVar70 = fVar70 / (float)(int)uVar54;
        uVar26 = uVar26 + iVar61;
        uVar53 = uVar53 + iVar61;
        if (0 < *(int *)&psVar66[1].gsubrs.data) {
          local_428._0_8_ = lVar68;
          iVar61 = atlas->TexGlyphPadding;
          lVar50 = 6;
          lVar62 = 0;
          do {
            if (*(int *)&psVar66[1].gsubrs.data <= lVar62) goto LAB_0022352a;
            iVar28 = stbtt_FindGlyphIndex
                               (psVar66,*(int *)(*(long *)&psVar66[1].gsubrs.cursor + lVar62 * 4));
            if (iVar28 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_draw.cpp"
                            ,0x99c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar66,iVar28,(float)pIVar83[lVar68].OversampleH * fVar70,
                       (float)pIVar83[lVar68].OversampleV * fVar70,fVar70,in_XMM3_Da,
                       (int *)local_258,(int *)local_440,(int *)&local_3c0,(int *)&local_44c);
            uVar54 = (pIVar83[lVar68].OversampleH +
                     (((stbtt_uint32)local_3c0 + iVar61) - (int)local_258[0].data)) - 1;
            lVar49 = *(long *)&psVar66[1].hmtx;
            *(short *)(lVar49 + -2 + lVar50) = (short)uVar54;
            uVar48 = (pIVar83[lVar68].OversampleV + ((local_44c + iVar61) - local_440._0_4_)) - 1;
            *(short *)(lVar49 + lVar50) = (short)uVar48;
            iVar27 = iVar27 + (uVar48 & 0xffff) * (uVar54 & 0xffff);
            lVar62 = lVar62 + 1;
            lVar50 = lVar50 + 0x10;
          } while (lVar62 < *(int *)&psVar66[1].gsubrs.data);
          lVar68 = local_428._0_8_;
        }
      }
      lVar68 = lVar68 + 1;
    } while (lVar68 != lVar40);
    fVar70 = (float)iVar27;
  }
  if (fVar70 < 0.0) {
    fVar70 = sqrtf(fVar70);
  }
  else {
    fVar70 = SQRT(fVar70);
  }
  atlas->TexHeight = 0;
  iVar27 = atlas->TexDesiredWidth;
  if (iVar27 < 1) {
    iVar61 = (int)fVar70;
    iVar27 = 0x1000;
    if ((iVar61 < 0xb33) && (iVar27 = 0x800, iVar61 < 0x599)) {
      iVar27 = (uint)(0x2cb < iVar61) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar27;
  local_450 = atlas->TexGlyphPadding;
  ptr_00 = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar61 = iVar27 - local_450;
  local_3d0 = (stbrp_node *)ImGui::MemAlloc((long)iVar61 << 4);
  if ((ptr_00 == (stbrp_context *)0x0) || (local_3d0 == (stbrp_node *)0x0)) {
    if (ptr_00 != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    if (local_3d0 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_3d0);
    }
    local_3d0 = (stbrp_node *)0x0;
    local_450 = 0;
    iVar27 = 0;
    ptr_00 = (stbrp_context *)0x0;
  }
  else {
    if ((local_450 < -0x7fff) || (0xffff < iVar61)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    if (iVar61 < 2) {
      uVar29 = 0;
    }
    else {
      uVar29 = 0;
      psVar10 = local_3d0;
      do {
        uVar29 = uVar29 + 1;
        psVar10->next = psVar10 + 1;
        psVar10 = psVar10 + 1;
      } while (iVar61 - 1 != uVar29);
      uVar29 = uVar29 & 0xffffffff;
    }
    local_3d0[uVar29].next = (stbrp_node *)0x0;
    ptr_00->init_mode = 1;
    ptr_00->heuristic = 0;
    ptr_00->free_head = local_3d0;
    ptr_00->active_head = ptr_00->extra;
    ptr_00->width = iVar61;
    ptr_00->height = 0x8000 - local_450;
    ptr_00->num_nodes = iVar61;
    ptr_00->align = (iVar61 * 2 + -1) / iVar61;
    ptr_00->extra[0].x = 0;
    ptr_00->extra[0].y = 0;
    ptr_00->extra[0].next = ptr_00->extra + 1;
    ptr_00->extra[1].x = (stbrp_coord)iVar61;
    ptr_00->extra[1].y = 0xffff;
    ptr_00->extra[1].next = (stbrp_node *)0x0;
  }
  local_2e8 = ptr_00;
  ImFontAtlasBuildPackCustomRects(atlas,ptr_00);
  if (0 < (int)uVar4) {
    lVar68 = 0;
    do {
      lVar62 = lVar68 * 0x110;
      iVar61 = *(int *)((long)local_490 + lVar62 + 0xe8);
      if (iVar61 != 0) {
        stbrp_pack_rects(local_2e8,*(stbrp_rect **)((long)local_490 + lVar62 + 200),iVar61);
        lVar50 = (long)*(int *)((long)local_490 + lVar62 + 0xe8);
        if (0 < lVar50) {
          lVar62 = *(long *)((long)local_490 + lVar62 + 200);
          lVar49 = 0;
          do {
            if (*(int *)(lVar62 + 0xc + lVar49) != 0) {
              iVar61 = (uint)*(ushort *)(lVar62 + 6 + lVar49) +
                       (uint)*(ushort *)(lVar62 + 10 + lVar49);
              if (iVar61 < atlas->TexHeight) {
                iVar61 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar61;
            }
            lVar49 = lVar49 + 0x10;
          } while (lVar50 * 0x10 != lVar49);
        }
      }
      lVar68 = lVar68 + 1;
    } while (lVar68 != lVar40);
  }
  uVar26 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar26 = (int)(uVar26 - 1) >> 1 | uVar26 - 1;
    uVar26 = (int)uVar26 >> 2 | uVar26;
    uVar26 = (int)uVar26 >> 4 | uVar26;
    uVar26 = (int)uVar26 >> 8 | uVar26;
    uVar26 = (int)uVar26 >> 0x10 | uVar26;
  }
  iVar28 = uVar26 + 1;
  atlas->TexHeight = iVar28;
  iVar61 = atlas->TexWidth;
  (atlas->TexUvScale).x = 1.0 / (float)iVar61;
  (atlas->TexUvScale).y = 1.0 / (float)iVar28;
  puVar33 = (uchar *)ImGui::MemAlloc((long)(iVar28 * iVar61));
  atlas->TexPixelsAlpha8 = puVar33;
  memset(puVar33,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < (int)uVar4) {
    local_358 = atlas->TexPixelsAlpha8;
    lVar62 = (long)iVar27;
    lVar50 = 0;
    local_310 = iVar27;
    lVar68 = lVar62;
    do {
      local_370 = lVar50;
      if ((atlas->ConfigData).Size <= lVar50) goto LAB_002235a6;
      if (*(int *)((long)local_490 + lVar50 * 0x110 + 0xe8) != 0) {
        psVar66 = (stbtt_fontinfo *)(lVar50 * 0x110 + (long)local_490);
        local_2d8 = *(float *)&psVar66[1].userdata;
        local_390 = psVar66;
        if (local_2d8 <= 0.0) {
          uStack_2d4 = 0x80000000;
          uStack_2d0 = 0x80000000;
          uStack_2cc = 0x80000000;
          local_2d8 = -local_2d8;
          uVar26 = (uint)(ushort)(*(ushort *)(psVar66->data + (long)psVar66->head + 0x12) << 8 |
                                 *(ushort *)(psVar66->data + (long)psVar66->head + 0x12) >> 8);
        }
        else {
          puVar33 = psVar66->data;
          lVar50 = (long)psVar66->hhea;
          uVar26 = ((int)(short)((ushort)puVar33[lVar50 + 4] << 8) | (uint)puVar33[lVar50 + 5]) -
                   ((int)(short)((ushort)puVar33[lVar50 + 6] << 8) | (uint)puVar33[lVar50 + 7]);
          uStack_2d4 = 0;
          uStack_2d0 = 0;
          uStack_2cc = 0;
        }
        local_2d8 = local_2d8 / (float)(int)uVar26;
        bVar65 = (byte)psVar66[1].glyf;
        fVar70 = (float)bVar65;
        local_37c = 0.0;
        local_380 = 0.0;
        local_410 = (ulong)bVar65;
        uVar29 = local_410;
        local_410._0_4_ = (uint)bVar65;
        if (bVar65 != 0) {
          local_380 = (float)(int)(1 - (uint)local_410) / (fVar70 + fVar70);
        }
        bVar2 = *(byte *)((long)&psVar66[1].glyf + 1);
        fVar77 = (float)bVar2;
        if (bVar2 != 0) {
          local_37c = (float)(int)(1 - (uint)bVar2) / (fVar77 + fVar77);
        }
        local_2b8 = (atlas->ConfigData).Data;
        local_410 = uVar29;
        if (0 < psVar66[1].fontstart) {
          lVar50._0_4_ = psVar66[1].hmtx;
          lVar50._4_4_ = psVar66[1].kern;
          fVar74 = 1.0 / fVar70;
          local_31c = fVar74;
          local_320 = 1.0 / fVar77;
          local_3b4 = fVar70 * local_2d8;
          fVar77 = fVar77 * local_2d8;
          fVar70 = fVar77;
          if (local_3b4 <= fVar77) {
            fVar70 = local_3b4;
          }
          local_374 = (0.35 / fVar70) * (0.35 / fVar70);
          local_268 = ZEXT416((uint)fVar77);
          fVar77 = -fVar77;
          local_48 = fVar77;
          uStack_44 = 0x80000000;
          uStack_40 = 0x80000000;
          uStack_3c = 0x80000000;
          local_290 = (ulong)bVar65;
          local_298 = (ulong)(uint)bVar2;
          local_408 = (ulong)bVar2;
          lVar49 = 0;
          local_2b0 = lVar50;
          do {
            if (((*(int *)(lVar50 + 0xc + lVar49 * 0x10) != 0) &&
                (lVar34 = lVar49 * 0x10 + lVar50, *(short *)(lVar34 + 4) != 0)) &&
               (*(short *)(lVar34 + 6) != 0)) {
              if (psVar66[1].data == (uchar *)0x0) {
                iVar27 = *(int *)((long)&psVar66[1].userdata + 4) + (int)lVar49;
              }
              else {
                iVar27 = *(int *)(psVar66[1].data + lVar49 * 4);
              }
              local_2a8 = (short *)(lVar49 * 0x1c + *(long *)&psVar66[1].loca);
              local_368 = lVar34;
              local_2a0 = lVar49;
              iVar61 = stbtt_FindGlyphIndex(psVar66,iVar27);
              lVar34 = local_368;
              sVar38 = (short)local_450;
              *(short *)(local_368 + 8) = *(short *)(local_368 + 8) + sVar38;
              *(short *)(local_368 + 10) = *(short *)(local_368 + 10) + sVar38;
              *(short *)(local_368 + 4) = *(short *)(local_368 + 4) - sVar38;
              *(short *)(local_368 + 6) = *(short *)(local_368 + 6) - sVar38;
              puVar33 = psVar66->data;
              uVar16 = *(ushort *)(puVar33 + (long)psVar66->hhea + 0x22) << 8 |
                       *(ushort *)(puVar33 + (long)psVar66->hhea + 0x22) >> 8;
              iVar27 = psVar66->hmtx;
              lVar50 = (ulong)uVar16 * 4 + (long)iVar27 + -4;
              lVar49 = (ulong)uVar16 * 4 + (long)iVar27 + -3;
              if (iVar61 < (int)(uint)uVar16) {
                lVar50 = (long)(iVar61 * 4) + (long)iVar27;
                lVar49 = (long)(iVar61 * 4) + 1 + (long)iVar27;
              }
              local_314 = (uint)puVar33[lVar50];
              local_318 = (uint)puVar33[lVar49];
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar66,iVar61,local_3b4,(float)local_268._0_4_,fVar74,fVar77,&local_300,
                         &local_304,&local_26c,&local_270);
              uVar54 = (uint)*(ushort *)(lVar34 + 8);
              uVar72 = 0;
              local_348 = (uchar *)(ulong)*(ushort *)(lVar34 + 10);
              local_3c8 = (ulong)*(ushort *)(lVar34 + 4);
              local_360 = (ulong)*(ushort *)(lVar34 + 6);
              uVar26 = stbtt_GetGlyphShape(psVar66,iVar61,(stbtt_vertex **)&local_3c0);
              uVar29 = local_408;
              uVar53 = ((int)local_3c8 - (int)local_410) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_390,iVar61,local_3b4,(float)local_268._0_4_,fVar74,fVar77,
                         (int *)&local_44c,&local_2fc,(int *)0x0,(int *)0x0);
              local_3ac = uVar53;
              if (uVar53 != 0) {
                iVar27 = ((int)local_360 - (int)uVar29) + 1;
                local_3a8._0_4_ = iVar27;
                if (iVar27 != 0) {
                  lVar50 = CONCAT44(local_3c0._4_4_,(stbtt_uint32)local_3c0);
                  local_258[0].data = (uchar *)((ulong)local_258[0].data & 0xffffffff00000000);
                  if ((int)uVar26 < 1) {
                    uVar41 = 0;
                  }
                  else {
                    lVar49 = 0;
                    uVar41 = 0;
                    do {
                      uVar41 = (ulong)((int)uVar41 +
                                      (uint)(*(char *)(lVar50 + 0xc + lVar49) == '\x01'));
                      lVar49 = lVar49 + 0xe;
                    } while ((ulong)uVar26 * 0xe != lVar49);
                  }
                  local_378 = local_2fc;
                  sVar25 = local_44c;
                  if ((int)uVar41 == 0) {
LAB_00221c44:
                    local_448 = (void *)0x0;
LAB_00221c4d:
                    points = (stbtt__point *)0x0;
                  }
                  else {
                    local_448 = ImGui::MemAlloc((long)(int)uVar41 << 2);
                    if (local_448 == (void *)0x0) {
                      uVar41 = 0;
                      goto LAB_00221c4d;
                    }
                    uVar56 = 0;
                    iVar27 = 0;
                    points = (stbtt__point *)0x0;
                    do {
                      local_428._0_8_ = uVar56;
                      if ((int)uVar56 == 0) {
LAB_00221a06:
                        local_258[0].data = (uchar *)((ulong)local_258[0].data & 0xffffffff00000000)
                        ;
                        if ((int)uVar26 < 1) {
                          lVar49 = -1;
                        }
                        else {
                          uVar53 = 0xffffffff;
                          fVar77 = 0.0;
                          lVar49 = 0;
                          fVar70 = 0.0;
                          lVar62 = lVar68;
                          do {
                            puVar33 = local_258[0].data;
                            switch(*(undefined1 *)(lVar50 + 0xc + lVar49)) {
                            case 1:
                              if (-1 < (int)uVar53) {
                                *(int *)((long)local_448 + (ulong)uVar53 * 4) =
                                     (int)local_258[0].data - iVar27;
                              }
                              uVar53 = uVar53 + 1;
                              sVar38 = *(short *)(lVar50 + lVar49);
                              sVar17 = *(short *)(lVar50 + 2 + lVar49);
                              iVar27 = (int)local_258[0].data;
                              break;
                            case 2:
                              sVar38 = *(short *)(lVar50 + lVar49);
                              sVar17 = *(short *)(lVar50 + 2 + lVar49);
                              break;
                            case 3:
                              stbtt__tesselate_curve
                                        (points,(int *)local_258,fVar70,fVar77,
                                         (float)(int)*(short *)(lVar50 + 4 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 6 + lVar49),
                                         (float)(int)*(short *)(lVar50 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 2 + lVar49),local_374,0);
                              goto LAB_00221b6b;
                            case 4:
                              stbtt__tesselate_cubic
                                        (points,(int *)local_258,fVar70,fVar77,
                                         (float)(int)*(short *)(lVar50 + 4 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 6 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 8 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 10 + lVar49),
                                         (float)(int)*(short *)(lVar50 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 2 + lVar49),local_374,0);
LAB_00221b6b:
                              fVar70 = (float)(int)*(short *)(lVar50 + lVar49);
                              fVar77 = (float)(int)*(short *)(lVar50 + 2 + lVar49);
                              puVar33 = local_258[0].data;
                            default:
                              goto switchD_00221a4a_default;
                            }
                            puVar33 = (uchar *)CONCAT44(local_258[0].data._4_4_,
                                                        (int)local_258[0].data + 1);
                            fVar77 = (float)(int)sVar17;
                            fVar70 = (float)(int)sVar38;
                            if (points != (stbtt__point *)0x0) {
                              points[(int)local_258[0].data].x = fVar70;
                              points[(int)local_258[0].data].y = fVar77;
                            }
switchD_00221a4a_default:
                            local_258[0].data = puVar33;
                            lVar49 = lVar49 + 0xe;
                          } while ((ulong)uVar26 * 0xe != lVar49);
                          lVar49 = (long)(int)uVar53;
                          uVar29 = local_408;
                          lVar68 = lVar62;
                        }
                        *(int *)((long)local_448 + lVar49 * 4) = (int)local_258[0].data - iVar27;
                        bVar15 = true;
                      }
                      else {
                        points = (stbtt__point *)ImGui::MemAlloc((long)(int)local_258[0].data << 3);
                        if (points != (stbtt__point *)0x0) goto LAB_00221a06;
                        points = (stbtt__point *)0x0;
                        bVar15 = false;
                      }
                      if (!bVar15) {
                        ImGui::MemFree(points);
                        ImGui::MemFree(local_448);
                        uVar41 = 0;
                        goto LAB_00221c44;
                      }
                      uVar56 = (ulong)(local_428._0_4_ + 1);
                    } while (local_428._0_4_ == 0);
                  }
                  local_350 = points;
                  if (points != (stbtt__point *)0x0) {
                    if ((int)uVar41 < 1) {
                      size = 0x14;
                    }
                    else {
                      uVar56 = 0;
                      lVar50 = 0;
                      do {
                        lVar50 = (long)(int)lVar50 + (long)*(int *)((long)local_448 + uVar56 * 4);
                        uVar56 = uVar56 + 1;
                      } while (uVar41 != uVar56);
                      size = lVar50 * 0x14 + 0x14;
                    }
                    p_00 = (stbtt__edge *)ImGui::MemAlloc(size);
                    if (p_00 != (stbtt__edge *)0x0) {
                      if ((int)uVar41 < 1) {
                        uVar56 = 0;
                      }
                      else {
                        uVar44 = 0;
                        uVar56 = 0;
                        iVar27 = 0;
                        do {
                          iVar61 = *(int *)((long)local_448 + uVar44 * 4);
                          if (0 < iVar61) {
                            uVar60 = (ulong)(iVar61 - 1);
                            uVar58 = 0;
                            do {
                              iVar28 = (int)uVar60;
                              fVar70 = local_350[(long)iVar27 + (long)iVar28].y;
                              fVar77 = local_350[(long)iVar27 + uVar58].y;
                              if ((fVar70 != fVar77) || (NAN(fVar70) || NAN(fVar77))) {
                                iVar59 = (int)uVar58;
                                iVar39 = iVar28;
                                if (fVar70 <= fVar77) {
                                  iVar39 = iVar59;
                                  iVar59 = iVar28;
                                }
                                iVar28 = (int)uVar56;
                                p_00[iVar28].invert = (uint)(fVar77 < fVar70);
                                p_00[iVar28].x0 =
                                     local_350[(long)iVar27 + (long)iVar39].x * local_3b4 + 0.0;
                                p_00[iVar28].y0 =
                                     local_350[(long)iVar27 + (long)iVar39].y * local_48 + 0.0;
                                p_00[iVar28].x1 =
                                     local_350[(long)iVar27 + (long)iVar59].x * local_3b4 + 0.0;
                                p_00[iVar28].y1 =
                                     local_350[(long)iVar27 + (long)iVar59].y * local_48 + 0.0;
                                uVar56 = (ulong)(iVar28 + 1);
                                lVar62 = lVar68;
                              }
                              uVar60 = uVar58 & 0xffffffff;
                              uVar58 = uVar58 + 1;
                              uVar29 = local_408;
                            } while ((long)uVar58 < (long)*(int *)((long)local_448 + uVar44 * 4));
                          }
                          iVar27 = iVar27 + iVar61;
                          uVar44 = uVar44 + 1;
                        } while (uVar44 != uVar41);
                      }
                      iVar27 = (int)uVar56;
                      stbtt__sort_edges_quicksort(p_00,iVar27);
                      if (1 < iVar27) {
                        uVar41 = 1;
                        do {
                          fVar70 = p_00[uVar41].x0;
                          fVar77 = p_00[uVar41].y0;
                          iVar61 = p_00[uVar41].invert;
                          local_258[0].cursor = iVar61;
                          local_258[0].data = *(uchar **)&p_00[uVar41].x1;
                          uVar44 = uVar41 & 0xffffffff;
                          do {
                            uVar26 = (uint)uVar44;
                            if ((int)uVar26 < 1) break;
                            fVar74 = p_00[uVar44 - 1].y0;
                            if (fVar77 < fVar74) {
                              psVar64 = p_00 + uVar44;
                              psVar64->invert = psVar64[-1].invert;
                              fVar71 = psVar64[-1].y0;
                              fVar76 = psVar64[-1].x1;
                              fVar73 = psVar64[-1].y1;
                              psVar64->x0 = psVar64[-1].x0;
                              psVar64->y0 = fVar71;
                              psVar64->x1 = fVar76;
                              psVar64->y1 = fVar73;
                              uVar44 = (ulong)(uVar26 - 1);
                            }
                            uVar26 = (uint)uVar44;
                          } while (fVar77 < fVar74);
                          if (uVar41 != uVar26) {
                            p_00[(int)uVar26].x0 = fVar70;
                            p_00[(int)uVar26].y0 = fVar77;
                            *(uchar **)&p_00[(int)uVar26].x1 = local_258[0].data;
                            p_00[(int)uVar26].invert = iVar61;
                          }
                          uVar41 = uVar41 + 1;
                        } while (uVar41 != uVar56);
                      }
                      uVar26 = (int)local_3c8 - (int)local_410;
                      local_3c8 = (ulong)uVar26;
                      local_440 = (undefined1  [8])0x0;
                      scanline = local_258;
                      if (0x3f < (int)uVar26) {
                        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3ac * 8 + 4);
                      }
                      uVar26 = (int)local_360 - (int)uVar29;
                      local_360 = (ulong)uVar26;
                      p_00[iVar27].y0 = (float)(local_3a8._0_4_ + local_378) + 1.0;
                      if (uVar26 < 0x7fffffff) {
                        local_348 = local_358 + (long)local_348 * lVar62 + CONCAT44(uVar72,uVar54);
                        local_308 = (float)(int)sVar25;
                        local_288 = (long)(int)local_3ac;
                        local_330 = (float *)((long)&scanline->data + local_288 * 4);
                        local_2e0 = local_330 + 1;
                        local_278 = local_288 * 4;
                        local_3b0 = (float)(int)local_3ac;
                        local_280 = (long)(int)(uint)local_3c8 * 4 + 8;
                        local_340 = 0;
                        local_338 = 0;
                        local_388 = (undefined8 *)0x0;
                        local_3fc = 0;
                        local_3f0 = (stbtt__active_edge *)0x0;
                        psVar64 = p_00;
                        iVar27 = local_378;
                        do {
                          fVar70 = (float)iVar27;
                          fVar77 = fVar70 + 1.0;
                          local_30c = iVar27;
                          memset(scanline,0,local_278);
                          memset(local_330,0,local_280);
                          psVar67 = local_3f0;
                          if (local_440 != (undefined1  [8])0x0) {
                            auVar36 = local_440;
                            psVar45 = (stbtt__active_edge *)local_440;
                            do {
                              psVar46 = (stbtt__active_edge *)auVar36;
                              if (((stbtt__active_edge *)auVar36)->ey <= fVar70) {
                                psVar45->next = ((stbtt__active_edge *)auVar36)->next;
                                if ((((stbtt__active_edge *)auVar36)->direction == 0.0) &&
                                   (!NAN(((stbtt__active_edge *)auVar36)->direction))) {
                                  __assert_fail("z->direction",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                                ,0xc63,
                                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                               );
                                }
                                ((stbtt__active_edge *)auVar36)->direction = 0.0;
                                ((stbtt__active_edge *)auVar36)->next = psVar67;
                                psVar46 = psVar45;
                                psVar67 = (stbtt__active_edge *)auVar36;
                              }
                              auVar36 = (undefined1  [8])psVar46->next;
                              psVar45 = psVar46;
                            } while (auVar36 != (undefined1  [8])0x0);
                          }
                          fVar74 = psVar64->y0;
                          if (fVar74 <= fVar77) {
                            bVar15 = local_378 != 0;
                            bVar69 = (int)local_338 == 0;
                            do {
                              if ((fVar74 != psVar64->y1) || (NAN(fVar74) || NAN(psVar64->y1))) {
                                if (psVar67 == (stbtt__active_edge *)0x0) {
                                  if (local_3fc == 0) {
                                    puVar37 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                    if (puVar37 == (undefined8 *)0x0) {
                                      local_3f0 = psVar67;
                                      psVar67 = (stbtt__active_edge *)0x0;
                                      goto LAB_002227ee;
                                    }
                                    *puVar37 = local_388;
                                    local_3fc = 800;
                                    local_388 = puVar37;
                                  }
                                  lVar62 = (long)local_3fc;
                                  local_3fc = local_3fc + -1;
                                  local_3f0 = psVar67;
                                  psVar67 = (stbtt__active_edge *)(local_388 + lVar62 * 4 + -3);
                                }
                                else {
                                  local_3f0 = psVar67->next;
                                }
LAB_002227ee:
                                if (psVar67 == (stbtt__active_edge *)0x0) {
                                  __assert_fail("z != __null",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                                ,0xad1,
                                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                               );
                                }
                                fVar74 = psVar64->x0;
                                fVar71 = psVar64->y0;
                                fVar76 = psVar64->y1;
                                fVar73 = (psVar64->x1 - fVar74) / (fVar76 - fVar71);
                                psVar67->fdx = fVar73;
                                psVar67->fdy = (float)(-(uint)(fVar73 != 0.0) & (uint)(1.0 / fVar73)
                                                      );
                                psVar67->fx = ((fVar70 - fVar71) * fVar73 + fVar74) - local_308;
                                psVar67->direction =
                                     *(float *)(&DAT_00345b74 + (ulong)(psVar64->invert == 0) * 4);
                                psVar67->sy = fVar71;
                                psVar67->ey = fVar76;
                                psVar67->next = (stbtt__active_edge *)0x0;
                                if (fVar76 < fVar70 && (bVar69 && bVar15)) {
                                  psVar67->ey = fVar70;
                                }
                                if (psVar67->ey < fVar70) {
                                  __assert_fail("z->ey >= scan_y_top",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                                ,0xc76,
                                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                               );
                                }
                                psVar67->next = (stbtt__active_edge *)local_440;
                                local_440 = (undefined1  [8])psVar67;
                              }
                              else {
                                local_3f0 = psVar67;
                              }
                              fVar74 = psVar64[1].y0;
                              psVar64 = psVar64 + 1;
                              psVar67 = local_3f0;
                              auVar36 = local_440;
                            } while (fVar74 <= fVar77);
                          }
                          else {
                            local_3f0 = psVar67;
                            auVar36 = local_440;
                          }
                          for (; auVar36 != (undefined1  [8])0x0;
                              auVar36 = (undefined1  [8])((stbtt__active_edge *)auVar36)->next) {
                            fVar74 = ((stbtt__active_edge *)auVar36)->ey;
                            if (fVar74 < fVar70) {
                              __assert_fail("e->ey >= y_top",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                            ,0xba5,
                                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                           );
                            }
                            fVar71 = ((stbtt__active_edge *)auVar36)->fx;
                            fVar76 = ((stbtt__active_edge *)auVar36)->fdx;
                            if ((fVar76 != 0.0) || (NAN(fVar76))) {
                              fVar73 = ((stbtt__active_edge *)auVar36)->sy;
                              if (fVar77 < fVar73) {
                                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                              ,3000,
                                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                             );
                              }
                              fVar80 = fVar76 + fVar71;
                              fVar75 = (float)(~-(uint)(fVar70 < fVar73) & (uint)fVar71 |
                                              (uint)((fVar73 - fVar70) * fVar76 + fVar71) &
                                              -(uint)(fVar70 < fVar73));
                              if ((((fVar75 < 0.0) ||
                                   (fVar79 = (float)(~-(uint)(fVar74 < fVar77) & (uint)fVar80 |
                                                    (uint)((fVar74 - fVar70) * fVar76 + fVar71) &
                                                    -(uint)(fVar74 < fVar77)), fVar79 < 0.0)) ||
                                  (local_3b0 <= fVar75)) || (local_3b0 <= fVar79)) {
                                if ((uint)local_3c8 < 0x7fffffff) {
                                  local_2f8 = ZEXT416((uint)fVar71);
                                  local_3a8 = ZEXT416((uint)fVar80);
                                  local_328 = CONCAT44(local_328._4_4_,fVar76);
                                  fVar74 = fVar70;
                                  uVar26 = 0;
                                  do {
                                    fVar73 = (float)(int)uVar26;
                                    uVar53 = uVar26 + 1;
                                    fVar75 = (float)(int)uVar53;
                                    fVar79 = (fVar73 - fVar71) / fVar76 + fVar74;
                                    fVar76 = (fVar75 - fVar71) / fVar76 + fVar74;
                                    local_428._0_4_ = fVar73;
                                    fVar70 = fVar74;
                                    if ((fVar73 <= fVar71) || (fVar80 <= fVar75)) {
                                      if ((fVar80 < fVar73) && (fVar75 < fVar71)) {
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar26,
                                                   (stbtt__active_edge *)auVar36,fVar71,fVar74,
                                                   fVar75,fVar76);
                                        fVar74 = fVar76;
                                        fVar71 = fVar75;
                                        fVar73 = (float)local_428._0_4_;
LAB_002223b4:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar26,
                                                   (stbtt__active_edge *)auVar36,fVar71,fVar74,
                                                   fVar73,fVar79);
                                        fVar71 = (float)local_428._0_4_;
                                        fVar74 = fVar79;
                                        goto LAB_002223d0;
                                      }
                                      if (((fVar71 < fVar73) && (fVar73 < fVar80)) ||
                                         ((fVar80 < fVar73 && (fVar73 < fVar71))))
                                      goto LAB_002223b4;
                                      if (((fVar71 < fVar75) && (fVar75 < fVar80)) ||
                                         ((fVar80 < fVar75 && (fVar75 < fVar71))))
                                      goto LAB_00222323;
                                    }
                                    else {
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar26,
                                                 (stbtt__active_edge *)auVar36,fVar71,fVar74,fVar73,
                                                 fVar79);
                                      fVar71 = (float)local_428._0_4_;
                                      fVar74 = fVar79;
LAB_00222323:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar26,
                                                 (stbtt__active_edge *)auVar36,fVar71,fVar74,fVar75,
                                                 fVar76);
                                      fVar71 = fVar75;
                                      fVar74 = fVar76;
LAB_002223d0:
                                      fVar80 = (float)local_3a8._0_4_;
                                    }
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar26,
                                               (stbtt__active_edge *)auVar36,fVar71,fVar74,fVar80,
                                               fVar77);
                                    fVar76 = (float)local_328;
                                    fVar71 = (float)local_2f8._0_4_;
                                    fVar80 = (float)local_3a8._0_4_;
                                    fVar74 = fVar70;
                                    uVar26 = uVar53;
                                  } while (local_3ac != uVar53);
                                }
                              }
                              else {
                                if (fVar73 <= fVar70) {
                                  fVar73 = fVar70;
                                }
                                uVar26 = (uint)fVar75;
                                if (fVar77 <= fVar74) {
                                  fVar74 = fVar77;
                                }
                                if (uVar26 == (int)fVar79) {
                                  if (((int)uVar26 < 0) || ((int)(uint)local_3c8 < (int)uVar26)) {
                                    __assert_fail("x >= 0 && x < len",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar29 = (ulong)uVar26;
                                  *(float *)((long)&scanline->data + uVar29 * 4) =
                                       (((fVar79 - (float)(int)uVar26) +
                                        (fVar75 - (float)(int)uVar26)) * -0.5 + 1.0) *
                                       ((stbtt__active_edge *)auVar36)->direction *
                                       (fVar74 - fVar73) +
                                       *(float *)((long)&scanline->data + uVar29 * 4);
                                  fVar71 = (fVar74 - fVar73) *
                                           ((stbtt__active_edge *)auVar36)->direction;
                                }
                                else {
                                  fVar76 = ((stbtt__active_edge *)auVar36)->fdy;
                                  fVar78 = fVar79;
                                  if (fVar79 < fVar75) {
                                    fVar71 = fVar70 - fVar73;
                                    fVar73 = (fVar70 - fVar74) + fVar77;
                                    fVar76 = -fVar76;
                                    fVar74 = fVar71 + fVar77;
                                    fVar78 = fVar75;
                                    fVar71 = fVar80;
                                    fVar75 = fVar79;
                                  }
                                  iVar61 = (int)fVar78;
                                  iVar27 = (int)fVar75 + 1;
                                  fVar79 = ((float)iVar27 - fVar71) * fVar76 + fVar70;
                                  fVar71 = ((stbtt__active_edge *)auVar36)->direction;
                                  fVar80 = (fVar79 - fVar73) * fVar71;
                                  lVar62 = (long)(int)fVar75;
                                  *(float *)((long)&scanline->data + lVar62 * 4) =
                                       (((fVar75 - (float)(int)fVar75) + 1.0) * -0.5 + 1.0) * fVar80
                                       + *(float *)((long)&scanline->data + lVar62 * 4);
                                  if (iVar61 - iVar27 != 0 && iVar27 <= iVar61) {
                                    do {
                                      *(float *)((long)&scanline->data + lVar62 * 4 + 4) =
                                           fVar76 * fVar71 * 0.5 + fVar80 +
                                           *(float *)((long)&scanline->data + lVar62 * 4 + 4);
                                      fVar80 = fVar80 + fVar76 * fVar71;
                                      lVar62 = lVar62 + 1;
                                    } while (iVar61 + -1 != (int)lVar62);
                                  }
                                  if (1.01 < ABS(fVar80)) {
                                    __assert_fail("fabsf(area) <= 1.01f",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar29 = (ulong)iVar61;
                                  *(float *)((long)&scanline->data + uVar29 * 4) =
                                       (fVar74 - (fVar76 * (float)(iVar61 - iVar27) + fVar79)) *
                                       (((fVar78 - (float)iVar61) + 0.0) * -0.5 + 1.0) * fVar71 +
                                       fVar80 + *(float *)((long)&scanline->data + uVar29 * 4);
                                  fVar71 = (fVar74 - fVar73) * fVar71;
                                }
                                local_2e0[uVar29] = fVar71 + local_2e0[uVar29];
                              }
                            }
                            else if (fVar71 < local_3b0) {
                              if (0.0 <= fVar71) {
                                local_2f8 = ZEXT416((uint)fVar71);
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,(int)fVar71,
                                           (stbtt__active_edge *)auVar36,fVar71,fVar70,fVar71,fVar77
                                          );
                                iVar27 = (int)fVar71 + 1;
                                fVar71 = (float)local_2f8._0_4_;
                              }
                              else {
                                iVar27 = 0;
                              }
                              stbtt__handle_clipped_edge
                                        (local_330,iVar27,(stbtt__active_edge *)auVar36,fVar71,
                                         fVar70,fVar71,fVar77);
                            }
                          }
                          auVar36 = local_440;
                          if ((uint)local_3c8 < 0x7fffffff) {
                            fVar70 = 0.0;
                            psVar35 = scanline;
                            uVar29 = local_340;
                            lVar62 = local_288;
                            do {
                              fVar70 = fVar70 + *(float *)((long)&psVar35->data + local_288 * 4);
                              iVar27 = (int)(ABS(*(float *)&psVar35->data + fVar70) * 255.0 + 0.5);
                              uVar55 = (uchar)iVar27;
                              if (0xfe < iVar27) {
                                uVar55 = 0xff;
                              }
                              local_348[(int)uVar29] = uVar55;
                              uVar29 = (ulong)((int)uVar29 + 1);
                              psVar35 = (stbtt__buf *)((long)&psVar35->data + 4);
                              lVar62 = lVar62 + -1;
                            } while (lVar62 != 0);
                          }
                          for (; auVar36 != (undefined1  [8])0x0;
                              auVar36 = (undefined1  [8])((stbtt__active_edge *)auVar36)->next) {
                            ((stbtt__active_edge *)auVar36)->fx =
                                 ((stbtt__active_edge *)auVar36)->fdx +
                                 ((stbtt__active_edge *)auVar36)->fx;
                          }
                          iVar27 = local_30c + 1;
                          iVar61 = (int)local_338;
                          local_338 = (ulong)(iVar61 + 1);
                          local_340 = (ulong)(uint)((int)local_340 + local_310);
                          puVar37 = local_388;
                          lVar62 = lVar68;
                          uVar29 = local_408;
                        } while (iVar61 != (int)local_360);
                      }
                      else {
                        local_388 = (undefined8 *)0x0;
                        puVar37 = local_388;
                        lVar62 = lVar68;
                      }
                      while (puVar37 != (undefined8 *)0x0) {
                        puVar8 = (undefined8 *)*puVar37;
                        ImGui::MemFree(puVar37);
                        puVar37 = puVar8;
                      }
                      if (scanline != local_258) {
                        ImGui::MemFree(scanline);
                      }
                      ImGui::MemFree(p_00);
                    }
                    ImGui::MemFree(local_448);
                    ImGui::MemFree(local_350);
                  }
                }
              }
              bVar65 = (byte)uVar29;
              ImGui::MemFree((void *)CONCAT44(local_3c0._4_4_,(stbtt_uint32)local_3c0));
              if (1 < (byte)local_410) {
                uVar16 = *(ushort *)(local_368 + 4);
                uVar3 = *(ushort *)(local_368 + 6);
                local_258[0].data = (uchar *)0x0;
                lVar62 = lVar68;
                if (uVar3 != 0) {
                  puVar33 = local_358 +
                            (ulong)*(ushort *)(local_368 + 10) * lVar68 +
                            (ulong)*(ushort *)(local_368 + 8);
                  iVar27 = uVar16 - (uint)local_410;
                  uVar29 = (ulong)(iVar27 + 1);
                  uVar26 = 0;
                  do {
                    uVar41 = local_410;
                    memset(local_258,0,local_410);
                    switch((int)uVar41) {
                    case 2:
                      if (iVar27 < 0) {
LAB_00222b74:
                        uVar56 = 0;
                        uVar41 = 0;
                      }
                      else {
                        uVar56 = 0;
                        uVar41 = 0;
                        do {
                          bVar65 = puVar33[uVar56];
                          bVar2 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 2 & 7)) =
                               bVar65;
                          uVar53 = (int)uVar41 + ((uint)bVar65 - (uint)bVar2);
                          uVar41 = (ulong)uVar53;
                          puVar33[uVar56] = (uchar)(uVar53 >> 1);
                          uVar56 = uVar56 + 1;
                        } while (uVar29 != uVar56);
                      }
                      break;
                    case 3:
                      if (iVar27 < 0) goto LAB_00222b74;
                      uVar56 = 0;
                      uVar41 = 0;
                      do {
                        bVar65 = puVar33[uVar56];
                        bVar2 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 3 & 7)) = bVar65
                        ;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar65 - (uint)bVar2));
                        puVar33[uVar56] = (uchar)(uVar41 / 3);
                        uVar56 = uVar56 + 1;
                      } while (uVar29 != uVar56);
                      break;
                    case 4:
                      if (iVar27 < 0) goto LAB_00222b74;
                      uVar56 = 0;
                      uVar41 = 0;
                      do {
                        bVar65 = puVar33[uVar56];
                        uVar44 = (ulong)((uint)uVar56 & 7);
                        bVar2 = *(byte *)((long)&local_258[0].data + uVar44);
                        *(byte *)((long)&local_258[0].data + (uVar44 ^ 4)) = bVar65;
                        uVar53 = (int)uVar41 + ((uint)bVar65 - (uint)bVar2);
                        uVar41 = (ulong)uVar53;
                        puVar33[uVar56] = (uchar)(uVar53 >> 2);
                        uVar56 = uVar56 + 1;
                      } while (uVar29 != uVar56);
                      break;
                    case 5:
                      if (iVar27 < 0) goto LAB_00222b74;
                      uVar56 = 0;
                      uVar41 = 0;
                      do {
                        bVar65 = puVar33[uVar56];
                        bVar2 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 5 & 7)) = bVar65
                        ;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar65 - (uint)bVar2));
                        puVar33[uVar56] = (uchar)(uVar41 / 5);
                        uVar56 = uVar56 + 1;
                      } while (uVar29 != uVar56);
                      break;
                    default:
                      if (iVar27 < 0) goto LAB_00222b74;
                      uVar56 = 0;
                      uVar41 = 0;
                      do {
                        bVar65 = puVar33[uVar56];
                        bVar2 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data +
                                 (ulong)((int)local_290 + (uint)uVar56 & 7)) = bVar65;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar65 - (uint)bVar2));
                        puVar33[uVar56] = (uchar)(uVar41 / (local_410 & 0xffffffff));
                        uVar56 = uVar56 + 1;
                      } while (uVar29 != uVar56);
                    }
                    if ((int)uVar56 < (int)(uint)uVar16) {
                      uVar56 = uVar56 & 0xffffffff;
                      do {
                        if (puVar33[uVar56] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar53 = (int)uVar41 -
                                 (uint)*(byte *)((long)&local_258[0].data +
                                                (ulong)((uint)uVar56 & 7));
                        uVar41 = (ulong)uVar53;
                        puVar33[uVar56] = (uchar)(uVar53 / (uint)local_410);
                        uVar56 = uVar56 + 1;
                      } while ((int)uVar56 < (int)(uint)uVar16);
                    }
                    puVar33 = puVar33 + lVar62;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar3);
                }
                bVar65 = (byte)local_408;
                lVar68 = lVar62;
              }
              if (1 < bVar65) {
                uVar16 = *(ushort *)(local_368 + 4);
                uVar26 = (uint)*(ushort *)(local_368 + 6);
                local_258[0].data = (uchar *)0x0;
                lVar62 = lVar68;
                if (uVar16 != 0) {
                  pbVar52 = local_358 +
                            (ulong)*(ushort *)(local_368 + 10) * lVar68 +
                            (ulong)*(ushort *)(local_368 + 8);
                  iVar27 = uVar26 - (uint)local_408;
                  uVar29 = (ulong)(iVar27 + 1);
                  uVar53 = 0;
                  do {
                    uVar41 = local_408;
                    memset(local_258,0,local_408);
                    switch((int)uVar41) {
                    case 2:
                      if (iVar27 < 0) {
LAB_00222e12:
                        uVar56 = 0;
                        uVar41 = 0;
                      }
                      else {
                        uVar56 = 0;
                        uVar41 = 0;
                        pbVar57 = pbVar52;
                        do {
                          bVar65 = *pbVar57;
                          bVar2 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 2 & 7)) =
                               bVar65;
                          uVar54 = (int)uVar41 + ((uint)bVar65 - (uint)bVar2);
                          uVar41 = (ulong)uVar54;
                          *pbVar57 = (byte)(uVar54 >> 1);
                          uVar56 = uVar56 + 1;
                          pbVar57 = pbVar57 + lVar62;
                        } while (uVar29 != uVar56);
                      }
                      break;
                    case 3:
                      if (iVar27 < 0) goto LAB_00222e12;
                      uVar56 = 0;
                      uVar41 = 0;
                      pbVar57 = pbVar52;
                      do {
                        bVar65 = *pbVar57;
                        bVar2 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 3 & 7)) = bVar65
                        ;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar65 - (uint)bVar2));
                        *pbVar57 = (byte)(uVar41 / 3);
                        uVar56 = uVar56 + 1;
                        pbVar57 = pbVar57 + lVar62;
                      } while (uVar29 != uVar56);
                      break;
                    case 4:
                      if (iVar27 < 0) goto LAB_00222e12;
                      uVar56 = 0;
                      uVar41 = 0;
                      pbVar57 = pbVar52;
                      do {
                        bVar65 = *pbVar57;
                        uVar44 = (ulong)((uint)uVar56 & 7);
                        bVar2 = *(byte *)((long)&local_258[0].data + uVar44);
                        *(byte *)((long)&local_258[0].data + (uVar44 ^ 4)) = bVar65;
                        uVar54 = (int)uVar41 + ((uint)bVar65 - (uint)bVar2);
                        uVar41 = (ulong)uVar54;
                        *pbVar57 = (byte)(uVar54 >> 2);
                        uVar56 = uVar56 + 1;
                        pbVar57 = pbVar57 + lVar62;
                      } while (uVar29 != uVar56);
                      break;
                    case 5:
                      if (iVar27 < 0) goto LAB_00222e12;
                      uVar56 = 0;
                      uVar41 = 0;
                      pbVar57 = pbVar52;
                      do {
                        bVar65 = *pbVar57;
                        bVar2 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 5 & 7)) = bVar65
                        ;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar65 - (uint)bVar2));
                        *pbVar57 = (byte)(uVar41 / 5);
                        uVar56 = uVar56 + 1;
                        pbVar57 = pbVar57 + lVar62;
                      } while (uVar29 != uVar56);
                      break;
                    default:
                      if (iVar27 < 0) goto LAB_00222e12;
                      uVar56 = 0;
                      uVar41 = 0;
                      pbVar57 = pbVar52;
                      do {
                        bVar65 = *pbVar57;
                        bVar2 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data +
                                 (ulong)((int)local_298 + (uint)uVar56 & 7)) = bVar65;
                        uVar41 = (ulong)((int)uVar41 + ((uint)bVar65 - (uint)bVar2));
                        *pbVar57 = (byte)(uVar41 / (local_408 & 0xffffffff));
                        uVar56 = uVar56 + 1;
                        pbVar57 = pbVar57 + lVar62;
                      } while (uVar29 != uVar56);
                    }
                    iVar61 = (int)uVar56;
                    iVar28 = uVar26 - iVar61;
                    if (iVar28 != 0 && iVar61 <= (int)uVar26) {
                      lVar68 = (long)iVar61;
                      pbVar57 = pbVar52 + lVar62 * lVar68;
                      do {
                        if (*pbVar57 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar54 = (int)uVar41 -
                                 (uint)*(byte *)((long)&local_258[0].data +
                                                (ulong)((uint)lVar68 & 7));
                        uVar41 = (ulong)uVar54;
                        *pbVar57 = (byte)(uVar54 / (uint)local_408);
                        lVar68 = lVar68 + 1;
                        pbVar57 = pbVar57 + lVar62;
                        iVar28 = iVar28 + -1;
                      } while (iVar28 != 0);
                    }
                    pbVar52 = pbVar52 + 1;
                    uVar53 = uVar53 + 1;
                    lVar68 = lVar62;
                  } while (uVar53 != uVar16);
                }
              }
              sVar17 = (short)*(undefined4 *)(local_368 + 8);
              *local_2a8 = sVar17;
              sVar38 = *(short *)(local_368 + 10);
              local_2a8[1] = sVar38;
              uVar16 = *(ushort *)(local_368 + 4);
              local_2a8[2] = sVar17 + uVar16;
              uVar3 = *(ushort *)(local_368 + 6);
              local_2a8[3] = sVar38 + uVar3;
              *(float *)(local_2a8 + 8) =
                   (float)(int)(short)((short)(local_314 << 8) + (short)local_318) * local_2d8;
              *(float *)(local_2a8 + 4) = (float)local_300 * local_31c + local_380;
              *(float *)(local_2a8 + 6) = (float)local_304 * local_320 + local_37c;
              *(float *)(local_2a8 + 10) =
                   (float)(int)(local_300 + (uint)uVar16) * local_31c + local_380;
              *(float *)(local_2a8 + 0xc) =
                   (float)(int)(local_304 + (uint)uVar3) * local_320 + local_37c;
              lVar49 = local_2a0;
              lVar50 = local_2b0;
              psVar66 = local_390;
              fVar74 = local_37c;
              fVar77 = local_380;
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 < psVar66[1].fontstart);
        }
        fVar70 = local_2b8[local_370].RasterizerMultiply;
        if ((fVar70 != 1.0) || (NAN(fVar70))) {
          lVar50 = 0;
          do {
            uVar26 = (uint)(long)((float)(int)lVar50 * fVar70);
            if (0xfe < uVar26) {
              uVar26 = 0xff;
            }
            *(char *)((long)&local_258[0].data + lVar50) = (char)uVar26;
            lVar50 = lVar50 + 1;
          } while (lVar50 != 0x100);
          psVar66 = local_390;
          if (0 < local_390[1].cff.cursor) {
            lVar49._0_4_ = local_390[1].hmtx;
            lVar49._4_4_ = local_390[1].kern;
            iVar27 = 0;
            do {
              if ((*(int *)(lVar49 + 0xc) != 0) && (*(ushort *)(lVar49 + 6) != 0)) {
                uVar16 = *(ushort *)(lVar49 + 4);
                iVar61 = atlas->TexWidth;
                puVar33 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar49 + 10) * (long)iVar61 +
                          (ulong)*(ushort *)(lVar49 + 8);
                uVar26 = (uint)*(ushort *)(lVar49 + 6);
                do {
                  if ((ulong)uVar16 != 0) {
                    uVar29 = 0;
                    do {
                      puVar33[uVar29] =
                           *(uchar *)((long)&local_258[0].data + (ulong)puVar33[uVar29]);
                      uVar29 = uVar29 + 1;
                    } while (uVar16 != uVar29);
                  }
                  puVar33 = puVar33 + iVar61;
                  bVar15 = 1 < (int)uVar26;
                  uVar26 = uVar26 - 1;
                } while (bVar15);
              }
              iVar27 = iVar27 + 1;
              lVar49 = lVar49 + 0x10;
            } while (iVar27 < local_390[1].cff.cursor);
          }
        }
        psVar66[1].hmtx = 0;
        psVar66[1].kern = 0;
      }
      lVar50 = local_370 + 1;
    } while (lVar50 != lVar40);
  }
  ImGui::MemFree(local_3d0);
  ImGui::MemFree(local_2e8);
  ptr = local_438._8_8_;
  if ((void *)local_438._8_8_ != (void *)0x0) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_438._8_8_;
    local_438 = auVar11 << 0x40;
    ImGui::MemFree((void *)ptr);
    local_438._8_8_ = 0;
  }
  if (0 < (int)uVar4) {
    lVar68 = 0;
    do {
      lVar62 = lVar68 * 0x110;
      if (*(int *)((long)local_490 + lVar62 + 0xe8) != 0) {
        if ((atlas->ConfigData).Size <= lVar68) goto LAB_002235a6;
        lVar50 = *(long *)((long)local_490 + lVar62 + 8);
        lVar49 = (long)*(int *)((long)local_490 + lVar62 + 0x24);
        uVar26 = (int)(short)((ushort)*(byte *)(lVar50 + 4 + lVar49) << 8) |
                 (uint)*(byte *)(lVar50 + 5 + lVar49);
        uVar72 = 0xbf800000;
        if (0 < (short)uVar26) {
          uVar72 = 0x3f800000;
        }
        local_428._0_4_ = uVar72;
        uVar53 = (int)(short)((ushort)*(byte *)(lVar50 + 6 + lVar49) << 8) |
                 (uint)*(byte *)(lVar50 + 7 + lVar49);
        local_468 = -1.0;
        if (0 < (short)uVar53) {
          local_468 = 1.0;
        }
        pIVar9 = (atlas->ConfigData).Data;
        pIVar83 = pIVar9 + lVar68;
        pIVar6 = pIVar9[lVar68].DstFont;
        if (pIVar9[lVar68].MergeMode == false) {
          fVar70 = pIVar9[lVar68].SizePixels;
          ImFont::ClearOutputData(pIVar6);
          fVar70 = fVar70 / (float)(int)(uVar26 - uVar53);
          pIVar6->FontSize = pIVar83->SizePixels;
          pIVar6->ConfigData = pIVar83;
          pIVar6->ConfigDataCount = 0;
          pIVar6->ContainerAtlas = atlas;
          pIVar6->Ascent = (float)(int)((float)(int)uVar26 * fVar70 + (float)local_428._0_4_);
          pIVar6->Descent = (float)(int)((float)(int)uVar53 * fVar70 + local_468);
        }
        pIVar6->ConfigDataCount = pIVar6->ConfigDataCount + 1;
        if (0 < *(int *)((long)local_490 + lVar62 + 0xe8)) {
          fVar70 = (pIVar83->GlyphOffset).x;
          local_428 = ZEXT416((uint)((float)(int)(pIVar6->Ascent + 0.5) + (pIVar83->GlyphOffset).y))
          ;
          lVar49 = 0;
          lVar50 = 0;
          do {
            if (*(int *)((long)local_490 + lVar62 + 0x100) <= lVar50) goto LAB_0022352a;
            lVar34 = *(long *)((long)local_490 + lVar62 + 0xd0);
            fVar74 = 1.0 / (float)atlas->TexHeight;
            fVar77 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar6,pIVar83,
                             *(ImWchar *)(*(long *)((long)local_490 + lVar62 + 0x108) + lVar50 * 4),
                             *(float *)(lVar34 + 8 + lVar49) + 0.0 + fVar70,
                             *(float *)(lVar34 + 0xc + lVar49) + 0.0 + (float)local_428._0_4_,
                             *(float *)(lVar34 + 0x14 + lVar49) + 0.0 + fVar70,
                             *(float *)(lVar34 + 0x18 + lVar49) + 0.0 + (float)local_428._0_4_,
                             (float)*(ushort *)(lVar34 + lVar49) * fVar77,
                             (float)*(ushort *)(lVar34 + 2 + lVar49) * fVar74,
                             (float)*(ushort *)(lVar34 + 4 + lVar49) * fVar77,
                             (float)*(ushort *)(lVar34 + 6 + lVar49) * fVar74,
                             *(float *)(lVar34 + 0x10 + lVar49));
            lVar50 = lVar50 + 1;
            lVar49 = lVar49 + 0x1c;
          } while (lVar50 < *(int *)((long)local_490 + lVar62 + 0xe8));
        }
      }
      lVar68 = lVar68 + 1;
    } while (lVar68 != lVar40);
  }
  sVar14 = local_2c0;
  if (0 < (int)uVar4) {
    sVar51 = 0;
    do {
      pvVar32 = *(void **)((long)local_490 + sVar51 + 0x108);
      if (pvVar32 != (void *)0x0) {
        ImGui::MemFree(pvVar32);
      }
      pvVar32 = *(void **)((long)local_490 + sVar51 + 0xf8);
      if (pvVar32 != (void *)0x0) {
        ImGui::MemFree(pvVar32);
      }
      sVar51 = sVar51 + 0x110;
    } while (sVar14 != sVar51);
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_3e0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3e0);
  }
  if ((void *)local_438._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_438._8_8_);
  }
LAB_00223418:
  bVar65 = (byte)((uint)uVar82 >> 0x18);
  if (local_3f8 != (void *)0x0) {
    ImGui::MemFree(local_3f8);
  }
  if (local_490 != (void *)0x0) {
    ImGui::MemFree(local_490);
  }
  return (bool)(bVar65 & 1);
LAB_002235bd:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_0022353f;
LAB_002235a6:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_0022353f;
LAB_0022352a:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_0022353f:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                ,0x68b,__function);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}